

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::compute_quotient_into(char *new_ext,char *new_rem_ext,char *ext1,char *ext2)

{
  byte *pbVar1;
  ushort uVar2;
  short sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  bool bVar10;
  bool bVar11;
  char *pcVar12;
  ushort *puVar13;
  char *pcVar14;
  err_frame_t *peVar15;
  CVmException *pCVar16;
  int16_t tmp_1;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int16_t tmp_2;
  byte bVar28;
  int iVar29;
  int iVar30;
  ushort *puVar31;
  long *in_FS_OFFSET;
  uint uVar40;
  undefined1 in_XMM3 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 uVar41;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  char *rem_ext;
  char *rem_ext2;
  ushort *local_168;
  char *dvs_ext;
  int local_158;
  uint dvs_hdl2;
  uint rem_hdl2;
  uint rem_hdl;
  ushort *local_148;
  char *local_140;
  char *dvs_ext2;
  uint dvs_hdl;
  ulong local_128;
  char *local_120;
  ulong local_118;
  err_frame_t err_cur__;
  
  if ((ext2[4] & 8U) != 0) {
    err_throw(0x7d8);
  }
  uVar21 = (uint)*(ushort *)new_ext;
  if ((ext1[4] & 8U) == 0) {
    uVar2 = *(ushort *)ext2;
    uVar19 = (uint)uVar2;
    uVar23 = (ulong)uVar19;
    if (uVar2 < *(ushort *)ext1) {
      uVar19 = (uint)*(ushort *)ext1;
    }
    local_148 = (ushort *)new_ext;
    local_120 = ext2;
    alloc_temp_regs((ulong)(uVar19 + ((short)uVar19 == 0) & 0xffff) + 2,3,&rem_ext,&rem_hdl,
                    &rem_ext2,&rem_hdl2,&dvs_ext2,&dvs_hdl2);
    G_err_frame::__tls_init();
    err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
    local_168 = (ushort *)new_rem_ext;
    local_140 = ext1;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      alloc_temp_regs(uVar23,1,&dvs_ext,&dvs_hdl);
    }
    if (err_cur__.state_ == 1) {
      err_cur__.state_ = 2;
      release_temp_regs(3,(ulong)rem_hdl,(ulong)rem_hdl2,(ulong)dvs_hdl2);
      err_rethrow();
    }
    peVar15 = err_cur__.prv_;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)peVar15;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pCVar16 = err_cur__.exc_;
      G_err_frame::__tls_init();
      *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar16;
      err_rethrow();
    }
    pcVar12 = local_140;
    puVar31 = local_168;
    local_118 = (ulong)uVar21;
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    copy_val(rem_ext,pcVar12,1);
    pcVar14 = local_120;
    copy_val(dvs_ext,local_120,1);
    puVar13 = local_148;
    sVar3 = *(short *)(pcVar12 + 2);
    iVar17 = (int)sVar3 - (int)*(short *)(pcVar14 + 2);
    *(short *)(dvs_ext + 2) = sVar3;
    if (iVar17 < 0 && puVar31 != (ushort *)0x0) {
      copy_val((char *)puVar31,rem_ext,1);
      puVar13[1] = 1;
      *(byte *)(puVar13 + 2) = (byte)puVar13[2] & 0xf0 | 8;
      memset((void *)((long)puVar13 + 5),0,(ulong)(*puVar13 + 1 >> 1));
    }
    else {
      iVar17 = iVar17 + 1;
      bVar11 = false;
      uVar23 = 0;
      iVar20 = 0;
      do {
        uVar21 = 0;
        if (2 < uVar2) {
          uVar21 = (uint)((byte)dvs_ext[6] >> 4);
        }
        iVar18 = (uint)((byte)rem_ext[6] >> 4) + ((byte)rem_ext[5] & 0xf) * 10 +
                 (uint)((byte)rem_ext[5] >> 4) * 100;
        iVar22 = ((byte)dvs_ext[5] & 0xf) * 10 + 1;
        if (uVar2 < 2) {
          iVar22 = 1;
        }
        iVar22 = (uint)((byte)dvs_ext[5] >> 4) * 100 + uVar21 + iVar22;
        iVar24 = (int)*(short *)(rem_ext + 2);
        iVar30 = (int)*(short *)(dvs_ext + 2);
        iVar29 = iVar24 - iVar30;
        if (iVar29 == 0 || iVar24 < iVar30) {
          if (iVar29 < -2) {
            iVar22 = 1000;
          }
          else if (iVar29 < 0) {
            uVar21 = (iVar30 - iVar24) - 1;
            auVar9._4_8_ = in_XMM3._8_8_;
            auVar9._0_4_ = 1;
            auVar36._0_8_ = auVar9._0_8_ << 0x20;
            auVar36._8_4_ = 1;
            auVar36._12_4_ = 1;
            auVar37._4_12_ = auVar36._4_12_;
            auVar37._0_4_ = iVar22;
            iVar22 = 4;
            do {
              uVar19 = auVar37._0_4_;
              auVar38._4_4_ = auVar37._4_4_;
              uVar40 = auVar37._8_4_;
              auVar38._12_4_ = auVar37._12_4_;
              iVar7 = uVar19 * 10;
              iVar25 = uVar40 * 10;
              auVar38._0_4_ = auVar38._4_4_;
              auVar38._8_4_ = auVar38._12_4_;
              uVar41 = (undefined4)((auVar38._8_8_ & 0xffffffff) * 10);
              iVar27 = iVar22 + -4;
              iVar29 = ((iVar30 - iVar24) + 3U & 0xfffffffc) + iVar22;
              auVar37._4_4_ = auVar38._4_4_ * 10;
              auVar37._0_4_ = iVar7;
              auVar37._8_4_ = iVar25;
              auVar37._12_4_ = uVar41;
              iVar22 = iVar27;
            } while (iVar29 != 8);
            uVar26 = -iVar27;
            auVar39._0_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)(uVar26 ^ 0x80000000));
            auVar39._4_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)((uVar26 | 1) ^ 0x80000000));
            auVar39._8_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)((uVar26 | 2) ^ 0x80000000));
            auVar39._12_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)((uVar26 | 3) ^ 0x80000000));
            auVar6._4_4_ = auVar38._4_4_ * 10;
            auVar6._0_4_ = iVar7;
            auVar6._8_4_ = iVar25;
            auVar6._12_4_ = uVar41;
            auVar4._4_4_ = auVar38._4_4_ & auVar39._4_4_;
            auVar4._0_4_ = uVar19 & auVar39._0_4_;
            auVar4._8_4_ = uVar40 & auVar39._8_4_;
            auVar4._12_4_ = auVar38._12_4_ & auVar39._12_4_;
            in_XMM3 = ~auVar39 & auVar6 | auVar4;
            iVar22 = in_XMM3._8_4_ * in_XMM3._0_4_ * in_XMM3._4_4_ * in_XMM3._12_4_;
          }
        }
        else {
          uVar21 = iVar29 - 1;
          auVar8._4_8_ = in_XMM3._8_8_;
          auVar8._0_4_ = 1;
          auVar32._0_8_ = auVar8._0_8_ << 0x20;
          auVar32._8_4_ = 1;
          auVar32._12_4_ = 1;
          auVar33._4_12_ = auVar32._4_12_;
          auVar33._0_4_ = iVar18;
          iVar18 = 4;
          do {
            uVar19 = auVar33._0_4_;
            auVar34._4_4_ = auVar33._4_4_;
            uVar40 = auVar33._8_4_;
            auVar34._12_4_ = auVar33._12_4_;
            iVar30 = uVar19 * 10;
            iVar7 = uVar40 * 10;
            auVar34._0_4_ = auVar34._4_4_;
            auVar34._8_4_ = auVar34._12_4_;
            uVar41 = (undefined4)((auVar34._8_8_ & 0xffffffff) * 10);
            iVar25 = iVar18 + -4;
            iVar24 = (iVar29 + 3U & 0x7ffffffc) + iVar18;
            auVar33._4_4_ = auVar34._4_4_ * 10;
            auVar33._0_4_ = iVar30;
            auVar33._8_4_ = iVar7;
            auVar33._12_4_ = uVar41;
            iVar18 = iVar25;
          } while (iVar24 != 8);
          uVar26 = -iVar25;
          auVar35._0_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)(uVar26 ^ 0x80000000));
          auVar35._4_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)((uVar26 | 1) ^ 0x80000000));
          auVar35._8_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)((uVar26 | 2) ^ 0x80000000));
          auVar35._12_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < (int)((uVar26 | 3) ^ 0x80000000));
          auVar5._4_4_ = auVar34._4_4_ * 10;
          auVar5._0_4_ = iVar30;
          auVar5._8_4_ = iVar7;
          auVar5._12_4_ = uVar41;
          in_XMM3._4_4_ = auVar34._4_4_ & auVar35._4_4_;
          in_XMM3._0_4_ = uVar19 & auVar35._0_4_;
          in_XMM3._8_4_ = uVar40 & auVar35._8_4_;
          in_XMM3._12_4_ = auVar34._12_4_ & auVar35._12_4_;
          in_XMM3 = ~auVar35 & auVar5 | in_XMM3;
          iVar18 = in_XMM3._8_4_ * in_XMM3._0_4_ * in_XMM3._4_4_ * in_XMM3._12_4_;
        }
        uVar19 = iVar18 / iVar22;
        uVar21 = 0;
        local_128 = uVar23;
        if ((int)uVar19 < 3) {
LAB_00271ac4:
          do {
            local_158 = iVar20;
            uVar19 = uVar21;
            pcVar14 = dvs_ext;
            pcVar12 = rem_ext;
            iVar20 = compare_abs(rem_ext,dvs_ext);
            if (iVar20 < 0) {
              bVar10 = false;
            }
            else if (iVar20 == 0) {
              uVar19 = uVar19 + 1;
              bVar11 = true;
              bVar10 = false;
            }
            else {
              compute_abs_diff_into(rem_ext2,pcVar12,pcVar14);
              pcVar12 = rem_ext;
              rem_ext = rem_ext2;
              rem_ext2 = pcVar12;
              bVar10 = true;
            }
            uVar23 = local_128;
            puVar31 = local_148;
            uVar21 = uVar19 + 1;
            iVar20 = local_158;
          } while (bVar10);
          if (local_128 < local_118) {
            bVar28 = (byte)local_128 & 1;
            *(byte *)((long)local_148 + (local_128 >> 1) + 5) =
                 (byte)((uVar19 & 0xf) << (bVar28 * '\x04' ^ 4)) |
                 '\x0f' << (bVar28 << 2) & *(byte *)((long)local_148 + (local_128 >> 1) + 5);
          }
          else if (local_128 == local_118) {
            local_148[1] = (ushort)iVar17;
            round_for_dropped_digits((char *)local_148,uVar19,(uint)!bVar11);
            bVar10 = false;
            iVar20 = local_158;
            goto LAB_00271c7f;
          }
          if (uVar19 != 0) {
            iVar20 = 1;
          }
          uVar23 = (iVar20 != 0) + local_128;
          iVar17 = iVar17 - (uint)(iVar20 == 0);
          if ((bVar11) ||
             ((local_168 != (ushort *)0x0 && ((uVar23 == local_118 || (iVar17 == (int)uVar23)))))) {
            if (uVar23 < local_118) {
              bVar28 = (((byte)local_128 + 1) - (iVar20 == 0)) * '\x04';
              do {
                pbVar1 = (byte *)((long)local_148 + (uVar23 >> 1) + 5);
                *pbVar1 = *pbVar1 & '\x0f' << (bVar28 & 4);
                uVar23 = uVar23 + 1;
                bVar28 = bVar28 + 4;
              } while (uVar23 < local_118);
            }
            local_148[1] = (ushort)iVar17;
            bVar10 = false;
          }
          else {
            *(short *)(dvs_ext + 2) = *(short *)(dvs_ext + 2) + -1;
            bVar10 = true;
            bVar11 = false;
          }
        }
        else {
          copy_val(dvs_ext2,dvs_ext,0);
          mul_by_long(dvs_ext2,(ulong)uVar19);
          compute_abs_diff_into(rem_ext2,rem_ext,dvs_ext2);
          pcVar12 = rem_ext;
          if ((rem_ext2[4] & 8U) == 0) {
            rem_ext = rem_ext2;
            rem_ext2 = pcVar12;
            uVar21 = uVar19;
            goto LAB_00271ac4;
          }
          bVar10 = false;
          bVar11 = true;
          uVar23 = local_128;
          puVar31 = local_148;
        }
LAB_00271c7f:
        puVar13 = local_168;
      } while (bVar10);
      if (local_168 != (ushort *)0x0) {
        if (bVar11) {
          local_168[1] = 1;
          *(byte *)(local_168 + 2) = (byte)local_168[2] & 0xf0 | 8;
          memset((void *)((long)local_168 + 5),0,(ulong)(*local_168 + 1 >> 1));
        }
        else {
          copy_val((char *)local_168,rem_ext,1);
          *(byte *)(puVar13 + 2) = (byte)puVar13[2] & 0xfe | local_140[4] & 1U;
          normalize((char *)puVar13);
        }
      }
      *(byte *)(puVar31 + 2) = (byte)puVar31[2] & 0xfe | (local_120[4] ^ local_140[4]) & 1U;
      normalize((char *)puVar31);
    }
    release_temp_regs(4,(ulong)rem_hdl,(ulong)rem_hdl2,(ulong)dvs_hdl,(ulong)dvs_hdl2);
  }
  else {
    new_ext[2] = '\x01';
    new_ext[3] = '\0';
    new_ext[4] = new_ext[4] & 0xf0U | 8;
    memset(new_ext + 5,0,(ulong)(uVar21 + 1 >> 1));
    if (new_rem_ext != (char *)0x0) {
      new_rem_ext[2] = '\x01';
      new_rem_ext[3] = '\0';
      new_rem_ext[4] = new_rem_ext[4] & 0xf0U | 8;
      memset(new_rem_ext + 5,0,(ulong)(*(ushort *)new_rem_ext + 1 >> 1));
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_quotient_into(char *new_ext,
                                         char *new_rem_ext,
                                         const char *ext1, const char *ext2)
{
    char *rem_ext;
    uint rem_hdl;
    char *rem_ext2;
    uint rem_hdl2;
    int quo_exp;
    size_t quo_idx;
    size_t quo_prec = get_prec(new_ext);
    size_t dvd_prec = get_prec(ext1);
    size_t dvs_prec = get_prec(ext2);
    char *dvs_ext;
    uint dvs_hdl;
    char *dvs_ext2;
    uint dvs_hdl2;
    int lead_dig_set;
    int zero_remainder;
    int acc;
    size_t rem_prec;

    /* if the divisor is zero, throw an error */
    if (is_zero(ext2))
        err_throw(VMERR_DIVIDE_BY_ZERO);

    /* if the dividend is zero, the result is zero */
    if (is_zero(ext1))
    {
        /* set the result to zero */
        set_zero(new_ext);

        /* if they want the remainder, it's zero also */
        if (new_rem_ext != 0)
            set_zero(new_rem_ext);

        /* we're done */
        return;
    }

    /* 
     *   Calculate the precision we need for the running remainder.  We
     *   must retain enough precision in the remainder to calculate exact
     *   differences, so we need the greater of the precisions of the
     *   dividend and the divisor, plus enough extra digits for the
     *   maximum relative shifting.  We'll have to shift at most one
     *   extra digit, but use two to be extra safe.  
     */
    rem_prec = dvd_prec;
    if (rem_prec < dvs_prec)
        rem_prec = dvs_prec;
    rem_prec += 2;

    /*   
     *   Make sure the precision is at least three, since it simplifies
     *   our digit approximation calculation.  
     */
    if (rem_prec < 3)
        rem_prec = 3;

    /* 
     *   Allocate two temporary registers for the running remainder, and
     *   one more for the multiplied divisor.  Note that we allocate the
     *   multiplied divisor at our higher precision so that we don't lose
     *   digits in our multiplier calculations.  
     */
    alloc_temp_regs(rem_prec, 3,
                    &rem_ext, &rem_hdl, &rem_ext2, &rem_hdl2,
                    &dvs_ext2, &dvs_hdl2);

    /* 
     *   Allocate another temp register for the shifted divisor.  Note
     *   that we need a different precision here, which is why we must
     *   make a separate allocation call 
     */
    err_try
    {
        /* make the additional allocation */
        alloc_temp_regs(dvs_prec, 1, &dvs_ext, &dvs_hdl);
    }